

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_linux.h
# Opt level: O0

void * snmalloc::PALLinux::reserve(size_t size)

{
  void *pvVar1;
  undefined8 in_RDI;
  void *p;
  
  pvVar1 = PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::reserve((size_t)p);
  if (pvVar1 != (void *)0x0) {
    prctl(0x53564d41,0,pvVar1,in_RDI,"snmalloc");
  }
  return pvVar1;
}

Assistant:

static void* reserve(size_t size) noexcept
    {
      void* p = PALPOSIX<PALLinux>::reserve(size);
      if (p)
      {
#  ifdef SNMALLOC_PAGEID
#    ifndef PR_SET_VMA
#      define PR_SET_VMA 0x53564d41
#      define PR_SET_VMA_ANON_NAME 0
#    endif

        /**
         *
         * If the kernel is set with CONFIG_ANON_VMA_NAME
         * the reserved pages would appear as follow
         *
         * 7fa5f0ceb000-7fa5f0e00000 rw-p 00000000 00:00 0 [anon:snmalloc]
         * 7fa5f0e00000-7fa5f1800000 rw-p 00000000 00:00 0 [anon:snmalloc]
         *
         */

        prctl(
          PR_SET_VMA,
          PR_SET_VMA_ANON_NAME,
          (unsigned long)p,
          size,
          (unsigned long)"snmalloc");
#  endif
      }
      return p;
    }